

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall SmallArray<DelayedType,_32U>::grow(SmallArray<DelayedType,_32U> *this,uint newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Allocator *pAVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  DelayedType *pDVar7;
  long lVar8;
  uint uVar9;
  DelayedType *pDVar10;
  ulong uVar11;
  
  uVar9 = (this->max >> 1) + this->max;
  uVar4 = newSize + 4;
  if (newSize < uVar9) {
    uVar4 = uVar9;
  }
  pAVar3 = this->allocator;
  if (pAVar3 == (Allocator *)0x0) {
    pDVar7 = (DelayedType *)(*(code *)NULLC::alloc)(uVar4 << 4 | 4);
    if (uVar4 != 0) {
      pDVar10 = pDVar7;
      do {
        pDVar10->index = 0;
        pDVar10->constants = (ExternConstantInfo *)0x0;
        pDVar10 = pDVar10 + 1;
      } while (pDVar10 != pDVar7 + (int)uVar4);
    }
  }
  else {
    iVar6 = (*pAVar3->_vptr_Allocator[2])(pAVar3,(ulong)(uVar4 << 4 | 4));
    pDVar7 = (DelayedType *)CONCAT44(extraout_var,iVar6);
    if (uVar4 != 0) {
      pDVar10 = pDVar7;
      do {
        pDVar10->index = 0;
        pDVar10->constants = (ExternConstantInfo *)0x0;
        pDVar10 = pDVar10 + 1;
      } while (pDVar10 != pDVar7 + (int)uVar4);
    }
  }
  if (this->count != 0) {
    lVar8 = 0;
    uVar11 = 0;
    do {
      puVar1 = (undefined8 *)((long)&this->data->index + lVar8);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pDVar7->index + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar11 = uVar11 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar11 < this->count);
  }
  pDVar10 = this->data;
  if (pDVar10 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pDVar10 != (DelayedType *)0x0) {
        (*(code *)NULLC::dealloc)(pDVar10);
      }
    }
    else if (pDVar10 != (DelayedType *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pDVar7;
  this->max = uVar4;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}